

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPass.cpp
# Opt level: O2

Ptr<RenderPass> __thiscall
myvk::RenderPass::Create(RenderPass *this,Ptr<Device> *device,VkRenderPassCreateInfo2 *create_info)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  VkResult VVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr<RenderPass> PVar3;
  shared_ptr<myvk::RenderPass> ret;
  _func_int **local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  std::make_shared<myvk::RenderPass>();
  std::__shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2> *)(local_38 + 3),
             &device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>);
  VVar2 = (*vkCreateRenderPass2)
                    (((device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                     ->m_device,create_info,(VkAllocationCallbacks *)0x0,
                     (VkRenderPass *)(local_38 + 5));
  _Var1._M_pi = a_Stack_30[0]._M_pi;
  if (VVar2 == VK_SUCCESS) {
    a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_DeviceObjectBase).super_Base._vptr_Base = local_38;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var1._M_pi;
  }
  else {
    (this->super_DeviceObjectBase).super_Base._vptr_Base = (_func_int **)0x0;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_30);
  PVar3.super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar3.super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<RenderPass>)PVar3.super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<RenderPass> RenderPass::Create(const Ptr<Device> &device, const VkRenderPassCreateInfo2 &create_info) {
	auto ret = std::make_shared<RenderPass>();
	ret->m_device_ptr = device;

	if (vkCreateRenderPass2(device->GetHandle(), &create_info, nullptr, &ret->m_render_pass) != VK_SUCCESS)
		return nullptr;
	return ret;
}